

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

ConstraintBlockSymbol *
slang::ast::ConstraintBlockSymbol::fromSyntax(Scope *scope,ConstraintPrototypeSyntax *syntax)

{
  short sVar1;
  Compilation *args;
  pointer pTVar2;
  size_t sVar3;
  Type *type;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  ConstraintBlockSymbol *this;
  long lVar4;
  byte bVar5;
  ClassType *classType;
  bitmask<slang::ast::ConstraintBlockFlags> *flags;
  SourceRange sourceRange;
  Token nameToken;
  SourceLocation local_50;
  Token local_48;
  string_view local_38;
  
  args = scope->compilation;
  local_48 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)(syntax->name).ptr);
  local_38 = parsing::Token::valueText(&local_48);
  local_50 = parsing::Token::location(&local_48);
  this = BumpAllocator::
         emplace<slang::ast::ConstraintBlockSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                   (&args->super_BumpAllocator,args,&local_38,&local_50);
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this->super_Symbol,scope,syntax_00);
  (this->flags).m_bits = (this->flags).m_bits | 8;
  flags = &this->flags;
  addSpecifierFlags(&syntax->specifiers,flags);
  pTVar2 = (syntax->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
  sVar3 = (syntax->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  lVar4 = 0;
  do {
    if (sVar3 << 4 == lVar4) {
      type = (Type *)scope->thisSym;
      if ((type->super_Symbol).kind == ClassType) {
        bVar5 = flags->m_bits;
        if (((bVar5 & 2) != 0) && ((char)type[2].super_Symbol.kind == Unknown)) {
          sourceRange = parsing::Token::range(&local_48);
          Scope::addDiag(scope,(DiagCode)0xb20006,sourceRange);
          bVar5 = flags->m_bits;
        }
        if ((bVar5 & 4) == 0) {
          addThisVar(this,type);
        }
      }
      return this;
    }
    sVar1 = *(short *)((long)&pTVar2->kind + lVar4);
    if (sVar1 == 0x11c) {
      bVar5 = 4;
LAB_0028c41d:
      flags->m_bits = flags->m_bits | bVar5;
    }
    else {
      if (sVar1 == 0xf8) {
        bVar5 = 2;
        goto LAB_0028c41d;
      }
      if (sVar1 == 0xa7) {
        bVar5 = 0x10;
        goto LAB_0028c41d;
      }
    }
    lVar4 = lVar4 + 0x10;
  } while( true );
}

Assistant:

ConstraintBlockSymbol& ConstraintBlockSymbol::fromSyntax(const Scope& scope,
                                                         const ConstraintPrototypeSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto nameToken = syntax.name->getLastToken();
    auto result = comp.emplace<ConstraintBlockSymbol>(comp, nameToken.valueText(),
                                                      nameToken.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);
    result->flags |= ConstraintBlockFlags::Extern;

    addSpecifierFlags(syntax.specifiers, result->flags);

    for (auto qual : syntax.qualifiers) {
        switch (qual.kind) {
            case TokenKind::StaticKeyword:
                result->flags |= ConstraintBlockFlags::Static;
                break;
            case TokenKind::ExternKeyword:
                result->flags |= ConstraintBlockFlags::ExplicitExtern;
                break;
            case TokenKind::PureKeyword:
                result->flags |= ConstraintBlockFlags::Pure;
                break;
            default:
                break;
        }
    }

    if (scope.asSymbol().kind == SymbolKind::ClassType) {
        auto& classType = scope.asSymbol().as<ClassType>();
        if (result->flags.has(ConstraintBlockFlags::Pure) && !classType.isAbstract)
            scope.addDiag(diag::PureConstraintInAbstract, nameToken.range());

        if (!result->flags.has(ConstraintBlockFlags::Static))
            result->addThisVar(classType);
    }

    return *result;
}